

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void deSemaphore_selfTest(void)

{
  deBool dVar1;
  deSemaphore dVar2;
  deThread threadptr;
  deThread threadptr_00;
  TestBuffer testBuffer;
  undefined1 auStack_a8 [128];
  deSemaphore local_28;
  deSemaphore local_20;
  int local_18;
  int local_14;
  
  dVar2 = deSemaphore_create(1,(deSemaphoreAttributes *)0x0);
  if (dVar2 == 0) {
    deAssertFail("semaphore",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x1ad);
  }
  deSemaphore_increment(dVar2);
  deSemaphore_decrement(dVar2);
  deSemaphore_decrement(dVar2);
  deSemaphore_destroy(dVar2);
  memset(auStack_a8,0,0x98);
  dVar2 = deSemaphore_create(0x20,(deSemaphoreAttributes *)0x0);
  local_28 = dVar2;
  local_20 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  if (dVar2 == 0 || local_20 == 0) {
    deAssertFail("testBuffer.empty && testBuffer.fill",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x1c2);
  }
  threadptr = deThread_create(consumerThread,auStack_a8,(deThreadAttributes *)0x0);
  threadptr_00 = deThread_create(producerThread,auStack_a8,(deThreadAttributes *)0x0);
  if (threadptr == 0 || threadptr_00 == 0) {
    deAssertFail("consumer && producer",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x1c7);
  }
  dVar1 = deThread_join(threadptr);
  if (dVar1 != 0) {
    dVar1 = deThread_join(threadptr_00);
    if (dVar1 != 0) goto LAB_00213993;
  }
  deAssertFail("ret",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
               ,0x1cb);
LAB_00213993:
  deThread_destroy(threadptr_00);
  deThread_destroy(threadptr);
  deSemaphore_destroy(local_28);
  deSemaphore_destroy(local_20);
  if (local_18 != local_14) {
    deAssertFail("testBuffer.producerHash == testBuffer.consumerHash",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x1d2);
  }
  return;
}

Assistant:

void deSemaphore_selfTest (void)
{
	/* Basic test. */
	{
		deSemaphore	semaphore	= deSemaphore_create(1, DE_NULL);
		DE_TEST_ASSERT(semaphore);

		deSemaphore_increment(semaphore);
		deSemaphore_decrement(semaphore);
		deSemaphore_decrement(semaphore);

		deSemaphore_destroy(semaphore);
	}

	/* Producer-consumer test. */
	{
		TestBuffer	testBuffer;
		deThread	producer;
		deThread	consumer;
		deBool		ret;

		deMemset(&testBuffer, 0, sizeof(testBuffer));

		testBuffer.empty	= deSemaphore_create(DE_LENGTH_OF_ARRAY(testBuffer.buffer), DE_NULL);
		testBuffer.fill		= deSemaphore_create(0, DE_NULL);

		DE_TEST_ASSERT(testBuffer.empty && testBuffer.fill);

		consumer	= deThread_create(consumerThread, &testBuffer, DE_NULL);
		producer	= deThread_create(producerThread, &testBuffer, DE_NULL);

		DE_TEST_ASSERT(consumer && producer);

		ret = deThread_join(consumer) &&
			  deThread_join(producer);
		DE_TEST_ASSERT(ret);

		deThread_destroy(producer);
		deThread_destroy(consumer);

		deSemaphore_destroy(testBuffer.empty);
		deSemaphore_destroy(testBuffer.fill);
		DE_TEST_ASSERT(testBuffer.producerHash == testBuffer.consumerHash);
	}
}